

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

Matrix __thiscall Matrix::Transpose(Matrix *this)

{
  uint uVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  long extraout_RDX;
  long lVar5;
  undefined8 *in_RSI;
  long lVar6;
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  Matrix MVar11;
  
  uVar1 = *(uint *)(in_RSI + 1);
  uVar10 = (ulong)uVar1;
  iVar2 = *(int *)((long)in_RSI + 0xc);
  lVar9 = (long)iVar2;
  this->rows = iVar2;
  this->cols = uVar1;
  uVar8 = 0xffffffffffffffff;
  if (-1 < (int)(iVar2 * uVar1)) {
    uVar8 = (ulong)(iVar2 * uVar1) * 8;
  }
  pdVar3 = (double *)operator_new__(uVar8);
  this->data = pdVar3;
  lVar5 = extraout_RDX;
  if (0 < lVar9) {
    pdVar4 = (double *)*in_RSI;
    lVar5 = uVar10 * 8;
    lVar6 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar8 = 0;
        pdVar7 = pdVar4;
        do {
          pdVar3[uVar8] = *pdVar7;
          uVar8 = uVar8 + 1;
          pdVar7 = pdVar7 + lVar9;
        } while (uVar10 != uVar8);
      }
      lVar6 = lVar6 + 1;
      pdVar3 = pdVar3 + uVar10;
      pdVar4 = pdVar4 + 1;
    } while (lVar6 != lVar9);
  }
  MVar11.rows = (int)lVar5;
  MVar11.cols = (int)((ulong)lVar5 >> 0x20);
  MVar11.data = (double *)this;
  return MVar11;
}

Assistant:

Matrix Matrix::Transpose() const
{
    int m = GetRows();
    int n = GetCols();
    Matrix T(n, m);
    for (int i = 0; i < n; ++i)
    {
        for (int j = 0; j < m; j++)
        {
            T(i, j) = this->operator()(j, i);
        }
    }
    return T;
}